

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O2

string * __thiscall
CNscContext::GetDefineValue_abi_cxx11_(CNscContext *this,DefineEntry *psDefine,bool fSimpleOnly)

{
  int iVar1;
  NscSymbolFence *pNVar2;
  string *psVar3;
  NscMessage nMessage;
  char szLineNumber [32];
  
  switch(psDefine->nMacro) {
  case NscMacro_Simple:
    return &psDefine->strValue;
  case NscMacro_FunctionLike:
    if (fSimpleOnly) {
      nMessage = NscMessage_ErrorFunctionLikeMacroNotAllowed;
    }
    else {
      nMessage = NscMessage_ErrorFunctionLikeMacroNotImpl;
    }
    GenerateMessage(this,nMessage);
    return &psDefine->strValue;
  case NscMacro_File:
    psVar3 = &this->m_strDefineScratch;
    std::__cxx11::string::assign((char *)psVar3);
    std::__cxx11::string::append((string *)psVar3);
    std::__cxx11::string::append((char *)psVar3);
    return psVar3;
  case NscMacro_Line:
    snprintf(szLineNumber,0x20,"%d",(ulong)(uint)this->m_pStreamTop->nLine);
    break;
  case NscMacro_Date:
    return &this->m_strCompileDate;
  case NscMacro_Time:
    return &this->m_strCompileTime;
  case NscMacro_NscCompilerDate:
    break;
  case NscMacro_NscCompilerTime:
    break;
  case NscMacro_Counter:
    snprintf(szLineNumber,0x20,"%d",(ulong)(uint)this->m_nPreprocessorCounter);
    this->m_nPreprocessorCounter = this->m_nPreprocessorCounter + 1;
    break;
  case NscMacro_Function:
    if (this->m_fPhase2 != false) {
      pNVar2 = GetCurrentFunctionFence(this);
      if (pNVar2 != (NscSymbolFence *)0x0) {
        if ((this->m_sSymbols).m_pauchData != (uchar *)0x0) {
          psVar3 = &this->m_strDefineScratch;
          std::__cxx11::string::assign((char *)psVar3);
          std::__cxx11::string::append((char *)psVar3);
          std::__cxx11::string::append((char *)psVar3);
          return psVar3;
        }
        __assert_fail("pSymbol != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                      ,0xa27,
                      "const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)");
      }
      GenerateMessage(this,NscMessage_ErrorFuncNameMacroNotInFunction);
    }
    break;
  default:
    if ((GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_ ==
         '\0') &&
       (iVar1 = __cxa_guard_acquire(&GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)
                                     ::strEmpty_abi_cxx11_), iVar1 != 0)) {
      GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                     strEmpty_abi_cxx11_.field_2;
      GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_.
      _M_string_length = 0;
      GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_.field_2.
      _M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                    strEmpty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                           strEmpty_abi_cxx11_);
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                  ,0xa36,"const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)"
                 );
  }
  std::__cxx11::string::assign((char *)&this->m_strDefineScratch);
  return &this->m_strDefineScratch;
}

Assistant:

const std::string *CNscContext::GetDefineValue (const DefineEntry *psDefine,
	bool fSimpleOnly)
{
	switch (psDefine ->nMacro)
	{

		//
		// If the define is simple replacement
		//

	case NscMacro_Simple:
		return &psDefine ->strValue;

		//
		// If the define is a function-like macro
		//

	case NscMacro_FunctionLike:
		if (fSimpleOnly)
		{
			GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotAllowed);
			return &psDefine ->strValue;
		}

		GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotImpl);
		return &psDefine ->strValue;

		//
		// If the define is __FILE__
		//

	case NscMacro_File:
		m_strDefineScratch = "\"";
		m_strDefineScratch += m_asFiles [GetCurrentFile ()] .strName;
		m_strDefineScratch += "\"";
		return &m_strDefineScratch;

		//
		// If the define is __LINE__
		//

	case NscMacro_Line:
		{
			char szLineNumber [32];

			snprintf (szLineNumber, sizeof (szLineNumber), "%d",
				GetCurrentLine ());

			m_strDefineScratch = szLineNumber;

			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __DATE__
		//

	case NscMacro_Date:
		return &m_strCompileDate;

		//
		// If the define is __TIME__
		//

	case NscMacro_Time:
		return &m_strCompileTime;

		//
		// If the define is __NSC_COMPILER_DATE__
		//

	case NscMacro_NscCompilerDate:
		m_strDefineScratch = "\"" __DATE__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __NSC_COMPILER_TIME__
		//

	case NscMacro_NscCompilerTime:
		m_strDefineScratch = "\"" __TIME__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __COUNTER__
		//

	case NscMacro_Counter:
		{
			char szCounter [32];

			snprintf (szCounter, sizeof (szCounter), "%d",
				m_nPreprocessorCounter);
			m_nPreprocessorCounter += 1;
			m_strDefineScratch = szCounter;
			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __FUNCTION__
		//

	case NscMacro_Function:
		{

			//
			// If we don't have to process this
			//

			if (!IsPhase2 ())
			{
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			//
			// Get the current function name
			//

			NscSymbolFence *pFunctionFence = GetCurrentFunctionFence ();
			NscSymbol *pSymbol;

			if (pFunctionFence == NULL)
			{
				GenerateMessage (NscMessage_ErrorFuncNameMacroNotInFunction);
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			pSymbol = GetSymbol (pFunctionFence ->nFnSymbol);
			assert (pSymbol != NULL);

			m_strDefineScratch = "\"";
			m_strDefineScratch += pSymbol ->szString;
			m_strDefineScratch += "\"";
			return &m_strDefineScratch;
		}
		break;

		//
		// Otherwise we have a missing case (Nsc.h out of sync)
		//

	default:
		static const std::string strEmpty;
		assert (false);
		return &strEmpty;

	}
}